

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_blurshader.cpp
# Opt level: O3

FString __thiscall
FBlurShader::FragmentShaderCode(FBlurShader *this,float blurAmount,int sampleCount,bool vertical)

{
  char in_CL;
  undefined7 in_register_00000011;
  int sampleCount_00;
  ulong uVar1;
  char *fmt;
  FString loopCode;
  TArray<int,_int> sampleOffsets;
  TArray<float,_float> sampleWeights;
  FString local_60;
  TArray<int,_int> local_58;
  TArray<float,_float> local_48;
  FBlurShader *local_38;
  
  local_48.Array = (float *)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  local_58.Array = (int *)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  sampleCount_00 = (int)CONCAT71(in_register_00000011,vertical);
  ComputeBlurSamples(this,sampleCount_00,blurAmount,&local_48,&local_58);
  local_60.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  if (0 < sampleCount_00) {
    fmt = "\r\n\t\t\ttextureOffset(SourceTexture, TexCoord, ivec2(%d, 0)) * %f";
    if (in_CL != '\0') {
      fmt = "\r\n\t\t\ttextureOffset(SourceTexture, TexCoord, ivec2(0, %d)) * %f";
    }
    uVar1 = 0;
    local_38 = this;
    do {
      if (uVar1 != 0) {
        FString::operator+=(&local_60," + ");
      }
      FString::AppendFormat
                (&local_60,fmt,(double)local_48.Array[uVar1],(ulong)(uint)local_58.Array[uVar1]);
      uVar1 = uVar1 + 1;
      this = local_38;
    } while ((CONCAT71(in_register_00000011,vertical) & 0xffffffff) != uVar1);
  }
  (this->mBlurSetups).Array = (BlurSetup *)0x8a502c;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FString::Format((FString *)this,
                  "\n\t\tin vec2 TexCoord;\n\t\tuniform sampler2D SourceTexture;\n\t\tout vec4 FragColor;\n\t\t#if __VERSION__ < 130\n\t\tuniform float ScaleX;\n\t\tuniform float ScaleY;\n\t\tvec4 textureOffset(sampler2D s, vec2 texCoord, ivec2 offset)\n\t\t{\n\t\t\treturn texture2D(s, texCoord + vec2(ScaleX * float(offset.x), ScaleY * float(offset.y)));\n\t\t}\n\t\t#endif\n\t\tvoid main()\n\t\t{\n\t\t\tFragColor = %s;\n\t\t}\n\t\t"
                  ,local_60.Chars);
  FString::~FString(&local_60);
  TArray<int,_int>::~TArray(&local_58);
  TArray<float,_float>::~TArray(&local_48);
  return (FString)(char *)this;
}

Assistant:

FString FBlurShader::FragmentShaderCode(float blurAmount, int sampleCount, bool vertical)
{
	TArray<float> sampleWeights;
	TArray<int> sampleOffsets;
	ComputeBlurSamples(sampleCount, blurAmount, sampleWeights, sampleOffsets);

	const char *fragmentShader =
		R"(
		in vec2 TexCoord;
		uniform sampler2D SourceTexture;
		out vec4 FragColor;
		#if __VERSION__ < 130
		uniform float ScaleX;
		uniform float ScaleY;
		vec4 textureOffset(sampler2D s, vec2 texCoord, ivec2 offset)
		{
			return texture2D(s, texCoord + vec2(ScaleX * float(offset.x), ScaleY * float(offset.y)));
		}
		#endif
		void main()
		{
			FragColor = %s;
		}
		)";

	FString loopCode;
	for (int i = 0; i < sampleCount; i++)
	{
		if (i > 0)
			loopCode += " + ";

		if (vertical)
			loopCode.AppendFormat("\r\n\t\t\ttextureOffset(SourceTexture, TexCoord, ivec2(0, %d)) * %f", sampleOffsets[i], (double)sampleWeights[i]);
		else
			loopCode.AppendFormat("\r\n\t\t\ttextureOffset(SourceTexture, TexCoord, ivec2(%d, 0)) * %f", sampleOffsets[i], (double)sampleWeights[i]);
	}

	FString code;
	code.Format(fragmentShader, loopCode.GetChars());
	return code;
}